

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

void train_shield_skill(void)

{
  obj *poVar1;
  boolean bVar2;
  
  poVar1 = uarms;
  if (uarms != (obj *)0x0) {
    bVar2 = donning_on(uarms);
    if (bVar2 == '\0') {
      train_skill_over_time
                (0x29,poVar1->owt,&u.ushieldtrain,0x2bc0,0x41a0,(uint)objects[0x88].oc_weight,
                 (uint)objects[0x8c].oc_weight);
    }
  }
  return;
}

Assistant:

void train_shield_skill(void)
{
    if (uarms && !donning_on(uarms)) {
	train_skill_over_time(
		P_SHIELD,
		uarms->owt,
		&u.ushieldtrain,
		11200,
		16800,
		objects[SMALL_SHIELD].oc_weight,
		objects[LARGE_SHIELD].oc_weight);
    }
}